

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_test.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_42fe24::ConvolveTestBase::SetUp(ConvolveTestBase *this)

{
  int iVar1;
  ConvolveFunctions *pCVar2;
  bool bVar3;
  undefined2 uVar4;
  ushort uVar5;
  uint32_t uVar6;
  ParamType *pPVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  undefined8 in_RSI;
  int i;
  ulong uVar11;
  int i_1;
  ACMRandom prng;
  Random local_1c;
  
  pPVar7 = testing::
           WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
           ::GetParam();
  pCVar2 = (pPVar7->
           super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>).
           super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>.
           super__Tuple_impl<2UL,_const_(anonymous_namespace)::ConvolveFunctions_*>.
           super__Head_base<2UL,_const_(anonymous_namespace)::ConvolveFunctions_*,_false>.
           _M_head_impl;
  this->UUT_ = pCVar2;
  iVar1 = pCVar2->use_highbd_;
  uVar10 = 0xff;
  if (iVar1 != 0) {
    uVar10 = ~(-1 << ((byte)iVar1 & 0x1f));
  }
  this->mask_ = uVar10;
  uVar11 = 0;
  do {
    bVar3 = IsIndexInBorder((ConvolveTestBase *)(uVar11 & 0xffffffff),(int)in_RSI);
    if (bVar3) {
      *(undefined1 *)((anonymous_namespace)::ConvolveTestBase::output_ + uVar11) = 0xff;
      uVar4 = (undefined2)this->mask_;
    }
    else {
      *(undefined1 *)((anonymous_namespace)::ConvolveTestBase::output_ + uVar11) = 0;
      uVar4 = 0;
    }
    *(undefined2 *)((anonymous_namespace)::ConvolveTestBase::output16_ + uVar11 * 2) = uVar4;
    uVar11 = uVar11 + 1;
  } while (uVar11 != 0x40000);
  local_1c.state_ = 0xbaba;
  uVar11 = 0;
  do {
    if ((uVar11 & 1) == 0) {
      uVar6 = testing::internal::Random::Generate(&local_1c,0x80000000);
      bVar8 = (byte)(uVar6 >> 0x17);
      bVar9 = bVar8 << 4;
      if ((char)bVar8 < '\0') {
        bVar9 = bVar8 >> 4;
      }
      *(byte *)((anonymous_namespace)::ConvolveTestBase::input_ + uVar11) = bVar9;
      uVar6 = testing::internal::Random::Generate(&local_1c,0x80000000);
      uVar5 = (ushort)(uVar6 >> 0xf) & (ushort)this->mask_;
    }
    else {
      *(undefined1 *)((anonymous_namespace)::ConvolveTestBase::input_ + uVar11) = 0xff;
      uVar5 = (ushort)this->mask_;
    }
    *(ushort *)((anonymous_namespace)::ConvolveTestBase::input16_ + uVar11 * 2) = uVar5;
    uVar11 = uVar11 + 1;
  } while (uVar11 != 0x40000);
  return;
}

Assistant:

void SetUp() override {
    UUT_ = GET_PARAM(2);
    if (UUT_->use_highbd_ != 0)
      mask_ = (1 << UUT_->use_highbd_) - 1;
    else
      mask_ = 255;
    /* Set up guard blocks for an inner block centered in the outer block */
    for (int i = 0; i < kOutputBufferSize; ++i) {
      if (IsIndexInBorder(i)) {
        output_[i] = 255;
        output16_[i] = mask_;
      } else {
        output_[i] = 0;
        output16_[i] = 0;
      }
    }

    ::libaom_test::ACMRandom prng;
    for (int i = 0; i < kInputBufferSize; ++i) {
      if (i & 1) {
        input_[i] = 255;
        input16_[i] = mask_;
      } else {
        input_[i] = prng.Rand8Extremes();
        input16_[i] = prng.Rand16() & mask_;
      }
    }
  }